

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char cVar19;
  AABBNodeMB4D *node1;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  vint4 ai_5;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai_2;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_4;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_2;
  vint4 bi;
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar26 = local_7d0;
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar41._4_4_ = fVar3;
  auVar41._0_4_ = fVar3;
  auVar41._8_4_ = fVar3;
  auVar41._12_4_ = fVar3;
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar46._4_4_ = fVar7;
  auVar46._0_4_ = fVar7;
  auVar46._8_4_ = fVar7;
  auVar46._12_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar48._4_4_ = fVar8;
  auVar48._0_4_ = fVar8;
  auVar48._8_4_ = fVar8;
  auVar48._12_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar49._4_4_ = fVar9;
  auVar49._0_4_ = fVar9;
  auVar49._8_4_ = fVar9;
  auVar49._12_4_ = fVar9;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar50._4_4_ = iVar10;
  auVar50._0_4_ = iVar10;
  auVar50._8_4_ = iVar10;
  auVar50._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar52._4_4_ = iVar10;
  auVar52._0_4_ = iVar10;
  auVar52._8_4_ = iVar10;
  auVar52._12_4_ = iVar10;
  auVar54._0_4_ = fVar7 * -fVar1;
  auVar54._4_4_ = fVar7 * -fVar1;
  auVar54._8_4_ = fVar7 * -fVar1;
  auVar54._12_4_ = fVar7 * -fVar1;
  auVar55._0_4_ = fVar8 * -fVar2;
  auVar55._4_4_ = fVar8 * -fVar2;
  auVar55._8_4_ = fVar8 * -fVar2;
  auVar55._12_4_ = fVar8 * -fVar2;
  auVar56._0_4_ = fVar9 * -fVar3;
  auVar56._4_4_ = fVar9 * -fVar3;
  auVar56._8_4_ = fVar9 * -fVar3;
  auVar56._12_4_ = fVar9 * -fVar3;
LAB_00589780:
  do {
    bVar11 = puVar26 != &local_7d8;
    if (puVar26 == &local_7d8) {
      return bVar11;
    }
    uVar23 = puVar26[-1];
    puVar26 = puVar26 + -1;
    while ((uVar23 & 8) == 0) {
      fVar3 = *(float *)(ray + k * 4 + 0xe0);
      uVar21 = (uint)uVar23 & 7;
      uVar20 = uVar23 & 0xfffffffffffffff0;
      if (uVar21 == 3) {
        auVar31 = *(undefined1 (*) [16])(uVar20 + 0x80);
        auVar14 = *(undefined1 (*) [16])(uVar20 + 0x90);
        fVar7 = 1.0 - fVar3;
        auVar38._4_4_ = fVar7;
        auVar38._0_4_ = fVar7;
        auVar38._8_4_ = fVar7;
        auVar38._12_4_ = fVar7;
        auVar51._0_4_ = fVar3 * *(float *)(uVar20 + 0xe0);
        auVar51._4_4_ = fVar3 * *(float *)(uVar20 + 0xe4);
        auVar51._8_4_ = fVar3 * *(float *)(uVar20 + 0xe8);
        auVar51._12_4_ = fVar3 * *(float *)(uVar20 + 0xec);
        auVar53._0_4_ = fVar3 * *(float *)(uVar20 + 0xf0);
        auVar53._4_4_ = fVar3 * *(float *)(uVar20 + 0xf4);
        auVar53._8_4_ = fVar3 * *(float *)(uVar20 + 0xf8);
        auVar53._12_4_ = fVar3 * *(float *)(uVar20 + 0xfc);
        auVar35._0_4_ = fVar3 * *(float *)(uVar20 + 0x100);
        auVar35._4_4_ = fVar3 * *(float *)(uVar20 + 0x104);
        auVar35._8_4_ = fVar3 * *(float *)(uVar20 + 0x108);
        auVar35._12_4_ = fVar3 * *(float *)(uVar20 + 0x10c);
        auVar32._0_12_ = ZEXT812(0);
        auVar32._12_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar51,auVar38,auVar32);
        auVar17 = vfmadd231ps_fma(auVar53,auVar38,auVar32);
        auVar34 = vfmadd231ps_fma(auVar35,auVar38,auVar32);
        auVar39._0_4_ = fVar6 * auVar31._0_4_;
        auVar39._4_4_ = fVar6 * auVar31._4_4_;
        auVar39._8_4_ = fVar6 * auVar31._8_4_;
        auVar39._12_4_ = fVar6 * auVar31._12_4_;
        auVar42._0_4_ = fVar6 * auVar14._0_4_;
        auVar42._4_4_ = fVar6 * auVar14._4_4_;
        auVar42._8_4_ = fVar6 * auVar14._8_4_;
        auVar42._12_4_ = fVar6 * auVar14._12_4_;
        auVar18._4_4_ = uVar5;
        auVar18._0_4_ = uVar5;
        auVar18._8_4_ = uVar5;
        auVar18._12_4_ = uVar5;
        auVar32 = vfmadd231ps_fma(auVar39,auVar18,*(undefined1 (*) [16])(uVar20 + 0x50));
        auVar33 = vfmadd231ps_fma(auVar42,auVar18,*(undefined1 (*) [16])(uVar20 + 0x60));
        auVar13._4_4_ = uVar4;
        auVar13._0_4_ = uVar4;
        auVar13._8_4_ = uVar4;
        auVar13._12_4_ = uVar4;
        auVar15 = vfmadd231ps_fma(auVar32,auVar13,*(undefined1 (*) [16])(uVar20 + 0x20));
        auVar33 = vfmadd231ps_fma(auVar33,auVar13,*(undefined1 (*) [16])(uVar20 + 0x30));
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar32 = vandps_avx(auVar57,auVar15);
        auVar44._8_4_ = 0x219392ef;
        auVar44._0_8_ = 0x219392ef219392ef;
        auVar44._12_4_ = 0x219392ef;
        auVar32 = vcmpps_avx(auVar32,auVar44,1);
        auVar15 = vblendvps_avx(auVar15,auVar44,auVar32);
        auVar32 = vandps_avx(auVar57,auVar33);
        auVar32 = vcmpps_avx(auVar32,auVar44,1);
        auVar12 = vblendvps_avx(auVar33,auVar44,auVar32);
        auVar32 = *(undefined1 (*) [16])(uVar20 + 0xa0);
        auVar33._0_4_ = auVar32._0_4_ * fVar6;
        auVar33._4_4_ = auVar32._4_4_ * fVar6;
        auVar33._8_4_ = auVar32._8_4_ * fVar6;
        auVar33._12_4_ = auVar32._12_4_ * fVar6;
        auVar33 = vfmadd231ps_fma(auVar33,auVar18,*(undefined1 (*) [16])(uVar20 + 0x70));
        auVar18 = vfmadd231ps_fma(auVar33,auVar13,*(undefined1 (*) [16])(uVar20 + 0x40));
        auVar33 = vandps_avx(auVar57,auVar18);
        auVar33 = vcmpps_avx(auVar33,auVar44,1);
        auVar33 = vblendvps_avx(auVar18,auVar44,auVar33);
        auVar18 = vrcpps_avx(auVar15);
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar15,auVar18,auVar36);
        auVar18 = vfmadd132ps_fma(auVar15,auVar18,auVar18);
        auVar15 = vrcpps_avx(auVar12);
        auVar12 = vfnmadd213ps_fma(auVar12,auVar15,auVar36);
        auVar13 = vfmadd132ps_fma(auVar12,auVar15,auVar15);
        auVar15 = vrcpps_avx(auVar33);
        auVar33 = vfnmadd213ps_fma(auVar33,auVar15,auVar36);
        auVar31 = vfmadd213ps_fma(auVar31,auVar41,*(undefined1 (*) [16])(uVar20 + 0xb0));
        auVar35 = vfmadd132ps_fma(auVar33,auVar15,auVar15);
        auVar15._4_4_ = fVar2;
        auVar15._0_4_ = fVar2;
        auVar15._8_4_ = fVar2;
        auVar15._12_4_ = fVar2;
        auVar33 = vfmadd231ps_fma(auVar31,auVar15,*(undefined1 (*) [16])(uVar20 + 0x50));
        auVar31 = vfmadd213ps_fma(auVar14,auVar41,*(undefined1 (*) [16])(uVar20 + 0xc0));
        auVar14 = vfmadd231ps_fma(auVar31,auVar15,*(undefined1 (*) [16])(uVar20 + 0x60));
        auVar31 = vfmadd213ps_fma(auVar32,auVar41,*(undefined1 (*) [16])(uVar20 + 0xd0));
        auVar31 = vfmadd231ps_fma(auVar31,auVar15,*(undefined1 (*) [16])(uVar20 + 0x70));
        auVar12._4_4_ = fVar1;
        auVar12._0_4_ = fVar1;
        auVar12._8_4_ = fVar1;
        auVar12._12_4_ = fVar1;
        auVar32 = vfmadd231ps_fma(auVar33,auVar12,*(undefined1 (*) [16])(uVar20 + 0x20));
        auVar33 = vfmadd231ps_fma(auVar14,auVar12,*(undefined1 (*) [16])(uVar20 + 0x30));
        auVar12 = vfmadd231ps_fma(auVar31,auVar12,*(undefined1 (*) [16])(uVar20 + 0x40));
        auVar31 = vsubps_avx(auVar16,auVar32);
        auVar14._4_4_ = fVar3 * *(float *)(uVar20 + 0x114) + fVar7;
        auVar14._0_4_ = fVar3 * *(float *)(uVar20 + 0x110) + fVar7;
        auVar14._8_4_ = fVar3 * *(float *)(uVar20 + 0x118) + fVar7;
        auVar14._12_4_ = fVar3 * *(float *)(uVar20 + 0x11c) + fVar7;
        auVar14 = vsubps_avx(auVar14,auVar32);
        auVar32 = vsubps_avx(auVar17,auVar33);
        auVar16._4_4_ = fVar3 * *(float *)(uVar20 + 0x124) + fVar7;
        auVar16._0_4_ = fVar3 * *(float *)(uVar20 + 0x120) + fVar7;
        auVar16._8_4_ = fVar3 * *(float *)(uVar20 + 0x128) + fVar7;
        auVar16._12_4_ = fVar3 * *(float *)(uVar20 + 300) + fVar7;
        auVar33 = vsubps_avx(auVar16,auVar33);
        auVar15 = vsubps_avx(auVar34,auVar12);
        auVar17._4_4_ = fVar7 + fVar3 * *(float *)(uVar20 + 0x134);
        auVar17._0_4_ = fVar7 + fVar3 * *(float *)(uVar20 + 0x130);
        auVar17._8_4_ = fVar7 + fVar3 * *(float *)(uVar20 + 0x138);
        auVar17._12_4_ = fVar7 + fVar3 * *(float *)(uVar20 + 0x13c);
        auVar12 = vsubps_avx(auVar17,auVar12);
        auVar34._0_4_ = auVar18._0_4_ * auVar31._0_4_;
        auVar34._4_4_ = auVar18._4_4_ * auVar31._4_4_;
        auVar34._8_4_ = auVar18._8_4_ * auVar31._8_4_;
        auVar34._12_4_ = auVar18._12_4_ * auVar31._12_4_;
        auVar37._0_4_ = auVar18._0_4_ * auVar14._0_4_;
        auVar37._4_4_ = auVar18._4_4_ * auVar14._4_4_;
        auVar37._8_4_ = auVar18._8_4_ * auVar14._8_4_;
        auVar37._12_4_ = auVar18._12_4_ * auVar14._12_4_;
        auVar40._0_4_ = auVar13._0_4_ * auVar32._0_4_;
        auVar40._4_4_ = auVar13._4_4_ * auVar32._4_4_;
        auVar40._8_4_ = auVar13._8_4_ * auVar32._8_4_;
        auVar40._12_4_ = auVar13._12_4_ * auVar32._12_4_;
        auVar45._0_4_ = auVar35._0_4_ * auVar15._0_4_;
        auVar45._4_4_ = auVar35._4_4_ * auVar15._4_4_;
        auVar45._8_4_ = auVar35._8_4_ * auVar15._8_4_;
        auVar45._12_4_ = auVar35._12_4_ * auVar15._12_4_;
        auVar43._0_4_ = auVar13._0_4_ * auVar33._0_4_;
        auVar43._4_4_ = auVar13._4_4_ * auVar33._4_4_;
        auVar43._8_4_ = auVar13._8_4_ * auVar33._8_4_;
        auVar43._12_4_ = auVar13._12_4_ * auVar33._12_4_;
        auVar47._0_4_ = auVar35._0_4_ * auVar12._0_4_;
        auVar47._4_4_ = auVar35._4_4_ * auVar12._4_4_;
        auVar47._8_4_ = auVar35._8_4_ * auVar12._8_4_;
        auVar47._12_4_ = auVar35._12_4_ * auVar12._12_4_;
        auVar31 = vpminsd_avx(auVar40,auVar43);
        auVar14 = vpminsd_avx(auVar45,auVar47);
        auVar31 = vmaxps_avx(auVar31,auVar14);
        auVar15 = vpminsd_avx(auVar34,auVar37);
        auVar33 = vpmaxsd_avx(auVar34,auVar37);
        auVar14 = vpmaxsd_avx(auVar40,auVar43);
        auVar32 = vpmaxsd_avx(auVar45,auVar47);
        auVar32 = vminps_avx(auVar14,auVar32);
        auVar14 = vmaxps_avx(auVar50,auVar15);
        auVar31 = vmaxps_avx(auVar14,auVar31);
        auVar14 = vminps_avx(auVar52,auVar33);
        auVar14 = vminps_avx(auVar14,auVar32);
        auVar31 = vcmpps_avx(auVar31,auVar14,2);
      }
      else {
        auVar30._4_4_ = fVar3;
        auVar30._0_4_ = fVar3;
        auVar30._8_4_ = fVar3;
        auVar30._12_4_ = fVar3;
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x80 + uVar27),auVar30,
                                  *(undefined1 (*) [16])(uVar20 + 0x20 + uVar27));
        auVar31 = vfmadd213ps_fma(auVar31,auVar46,auVar54);
        auVar14 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x80 + uVar25),auVar30,
                                  *(undefined1 (*) [16])(uVar20 + 0x20 + uVar25));
        auVar14 = vfmadd213ps_fma(auVar14,auVar48,auVar55);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x80 + uVar28),auVar30,
                                  *(undefined1 (*) [16])(uVar20 + 0x20 + uVar28));
        auVar31 = vpmaxsd_avx(auVar31,auVar14);
        auVar14 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x80 + (uVar27 ^ 0x10)),auVar30,
                                  *(undefined1 (*) [16])(uVar20 + 0x20 + (uVar27 ^ 0x10)));
        auVar33 = vfmadd213ps_fma(auVar32,auVar49,auVar56);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x80 + (uVar25 ^ 0x10)),auVar30,
                                  *(undefined1 (*) [16])(uVar20 + 0x20 + (uVar25 ^ 0x10)));
        auVar14 = vfmadd213ps_fma(auVar14,auVar46,auVar54);
        auVar32 = vfmadd213ps_fma(auVar32,auVar48,auVar55);
        auVar32 = vpminsd_avx(auVar14,auVar32);
        auVar14 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x80 + (uVar28 ^ 0x10)),auVar30,
                                  *(undefined1 (*) [16])(uVar20 + 0x20 + (uVar28 ^ 0x10)));
        auVar15 = vfmadd213ps_fma(auVar14,auVar49,auVar56);
        auVar14 = vpmaxsd_avx(auVar33,auVar50);
        auVar31 = vpmaxsd_avx(auVar31,auVar14);
        auVar14 = vpminsd_avx(auVar15,auVar52);
        auVar14 = vpminsd_avx(auVar32,auVar14);
        if (uVar21 == 6) {
          auVar14 = vcmpps_avx(auVar31,auVar14,2);
          auVar31 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0xe0),auVar30,2);
          auVar32 = vcmpps_avx(auVar30,*(undefined1 (*) [16])(uVar20 + 0xf0),1);
          auVar31 = vandps_avx(auVar31,auVar32);
          auVar31 = vandps_avx(auVar31,auVar14);
        }
        else {
          auVar31 = vcmpps_avx(auVar31,auVar14,2);
        }
      }
      auVar31 = vpslld_avx(auVar31,0x1f);
      uVar21 = vmovmskps_avx(auVar31);
      if (uVar21 == 0) goto LAB_00589780;
      uVar21 = uVar21 & 0xff;
      lVar24 = 0;
      for (uVar23 = (ulong)uVar21; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar23 = *(ulong *)(uVar20 + lVar24 * 8);
      uVar21 = uVar21 - 1 & uVar21;
      uVar22 = (ulong)uVar21;
      if (uVar21 != 0) {
        *puVar26 = uVar23;
        lVar24 = 0;
        for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          lVar24 = lVar24 + 1;
        }
        uVar21 = uVar21 - 1 & uVar21;
        uVar22 = (ulong)uVar21;
        bVar29 = uVar21 == 0;
        while( true ) {
          puVar26 = puVar26 + 1;
          uVar23 = *(ulong *)(uVar20 + lVar24 * 8);
          if (bVar29) break;
          *puVar26 = uVar23;
          lVar24 = 0;
          for (uVar23 = uVar22; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          uVar22 = uVar22 - 1 & uVar22;
          bVar29 = uVar22 == 0;
        }
      }
    }
    cVar19 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40 + 0x28))
                       (pre,ray,k,context);
    if (cVar19 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
      return bVar11;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }